

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

bid_t filemgr_alloc(filemgr *file,err_log_callback *log_callback)

{
  ulong in_RAX;
  bid_t bVar1;
  ssize_t sVar2;
  ulong uStack_28;
  uint8_t _buf;
  
  uStack_28 = in_RAX;
  pthread_spin_lock(&file->lock);
  if ((file->status).super___atomic_base<unsigned_char>._M_i == '\0') {
    if (sb_ops.alloc_block != (_func_bid_t_filemgr_ptr *)0x0 && file->sb != (superblock *)0x0) {
      bVar1 = (*sb_ops.alloc_block)(file);
      if (bVar1 != 0xffffffffffffffff) goto LAB_00114aac;
    }
  }
  bVar1 = (file->pos).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize;
  atomic_add_uint64_t(&file->pos,(ulong)file->blocksize,memory_order_seq_cst);
LAB_00114aac:
  if (global_config.ncacheblock < 1) {
    uStack_28 = uStack_28 & 0xffffffffffffff;
    sVar2 = (*file->ops->pwrite)(file->fd,&_buf,1,(ulong)file->blocksize * (bVar1 + 1) + -1);
    _log_errno_str(file->ops,log_callback,(fdb_status)sVar2,"WRITE",file->filename);
  }
  pthread_spin_unlock(&file->lock);
  return bVar1;
}

Assistant:

bid_t filemgr_alloc(struct filemgr *file, err_log_callback *log_callback)
{
    spin_lock(&file->lock);
    bid_t bid = BLK_NOT_FOUND;

    // block reusing is not allowed for being compacted file
    // for easy implementation.
    if (filemgr_get_file_status(file) == FILE_NORMAL &&
        file->sb && sb_ops.alloc_block) {
        bid = sb_ops.alloc_block(file);
    }
    if (bid == BLK_NOT_FOUND) {
        bid = atomic_get_uint64_t(&file->pos) / file->blocksize;
        atomic_add_uint64_t(&file->pos, file->blocksize);
    }

    if (global_config.ncacheblock <= 0) {
        // if block cache is turned off, write the allocated block before use
        uint8_t _buf = 0x0;
        ssize_t rv = file->ops->pwrite(file->fd, &_buf, 1,
                                       (bid+1) * file->blocksize - 1);
        _log_errno_str(file->ops, log_callback, (fdb_status) rv, "WRITE", file->filename);
    }
    spin_unlock(&file->lock);

    return bid;
}